

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::TraceConfig_CmdTraceStartDelay::ParseFromArray
          (TraceConfig_CmdTraceStartDelay *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  uint8_t cur_byte_2;
  uint8_t cur_byte;
  ulong uVar10;
  uint8_t cur_byte_1;
  ulong *puVar11;
  Field local_48;
  ulong *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  local_38 = (ulong *)raw;
  do {
    if (puVar8 <= local_38) goto switchD_002392e7_caseD_3;
    bVar1 = (byte)*local_38;
    uVar7 = (ulong)bVar1;
    puVar9 = (ulong *)((long)local_38 + 1);
    if ((char)bVar1 < '\0') {
      uVar7 = (ulong)(bVar1 & 0x7f);
      lVar5 = 7;
      do {
        if ((puVar8 <= puVar9) || (0x38 < lVar5 - 7U)) goto switchD_002392e7_caseD_3;
        uVar4 = *puVar9;
        puVar9 = (ulong *)((long)puVar9 + 1);
        uVar7 = uVar7 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar5 & 0x3f);
        lVar5 = lVar5 + 7;
      } while ((char)(byte)uVar4 < '\0');
    }
    uVar4 = uVar7 >> 3;
    if (((uint)uVar4 == 0) || (puVar8 <= puVar9)) goto switchD_002392e7_caseD_3;
    switch((uint)uVar7 & 7) {
    case 0:
      uVar6 = 0;
      uVar10 = 0;
      while( true ) {
        puVar11 = (ulong *)((long)puVar9 + 1);
        uVar6 = (ulong)((byte)*puVar9 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar6;
        if (-1 < (char)(byte)*puVar9) break;
        if ((puVar8 <= puVar11) ||
           (bVar2 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar9 = puVar11, bVar2))
        goto switchD_002392e7_caseD_3;
      }
      local_48.int_value_ = uVar6 & 0xffffffff00000000;
      break;
    case 1:
      puVar11 = puVar9 + 1;
      if (puVar8 < puVar11) goto switchD_002392e7_caseD_3;
      uVar6 = *puVar9;
      local_48.int_value_ = uVar6 & 0xffffffff00000000;
      break;
    case 2:
      puVar9 = (ulong *)((long)puVar9 + 1);
      uVar10 = 0;
      uVar6 = 0;
      puVar11 = puVar9;
      while (uVar10 = (ulong)(*(byte *)((long)puVar11 + -1) & 0x7f) << ((byte)uVar6 & 0x3f) | uVar10
            , (char)*(byte *)((long)puVar11 + -1) < '\0') {
        if (puVar8 <= puVar11) goto switchD_002392e7_caseD_3;
        puVar11 = (ulong *)((long)puVar11 + 1);
        puVar9 = (ulong *)((long)puVar9 + 1);
        bVar2 = 0x38 < uVar6;
        uVar6 = uVar6 + 7;
        if (bVar2) goto switchD_002392e7_caseD_3;
      }
      if (uVar10 <= (ulong)((long)puVar8 - (long)puVar9)) {
        local_48.int_value_ = (ulong)puVar9 & 0xffffffff00000000;
        puVar11 = (ulong *)((long)puVar11 + uVar10);
        uVar6 = (ulong)puVar9 & 0xffffffff;
        goto LAB_002393c3;
      }
    default:
      goto switchD_002392e7_caseD_3;
    case 5:
      puVar11 = (ulong *)((long)puVar9 + 4);
      if (puVar8 < puVar11) goto switchD_002392e7_caseD_3;
      uVar6 = (ulong)(uint)*puVar9;
      local_48.int_value_ = 0;
    }
    uVar10 = 0;
LAB_002393c3:
    local_38 = puVar11;
  } while ((0xffff < (uint)uVar4) || (0xfffffff < uVar10));
  local_48.int_value_ = local_48.int_value_ | uVar6 & 0xffffffff;
  uVar6 = uVar4 << 0x20 | uVar10;
  local_48.type_ = (byte)(uVar6 >> 0x30) | (byte)uVar7 & 7;
  local_48.size_ = (uint32_t)uVar10;
  local_48.id_ = (uint16_t)(uVar6 >> 0x20);
  sVar3 = (short)uVar4;
  while (sVar3 != 0) {
    if ((ushort)uVar4 < 3) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar4 & 0x3f);
    }
    if ((ushort)uVar4 == 2) {
      this->max_delay_ms_ = (uint32_t)local_48.int_value_;
    }
    else if (((uint)uVar4 & 0xffff) == 1) {
      this->min_delay_ms_ = (uint32_t)local_48.int_value_;
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                (&local_48,&this->unknown_fields_);
    }
    do {
      if (puVar8 <= local_38) goto switchD_002392e7_caseD_3;
      bVar1 = (byte)*local_38;
      uVar7 = (ulong)(uint)bVar1;
      puVar9 = (ulong *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar5 = 7;
        do {
          if ((puVar8 <= puVar9) || (0x38 < lVar5 - 7U)) goto switchD_002392e7_caseD_3;
          uVar4 = *puVar9;
          puVar9 = (ulong *)((long)puVar9 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar5 & 0x3f);
          lVar5 = lVar5 + 7;
        } while ((char)(byte)uVar4 < '\0');
      }
      uVar4 = uVar7 >> 3;
      if (((uint)uVar4 == 0) || (puVar8 <= puVar9)) goto switchD_002392e7_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar6 = 0;
        uVar10 = 0;
        while( true ) {
          puVar11 = (ulong *)((long)puVar9 + 1);
          uVar6 = (ulong)((byte)*puVar9 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar6;
          if (-1 < (char)(byte)*puVar9) break;
          if ((puVar8 <= puVar11) ||
             (bVar2 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar9 = puVar11, bVar2))
          goto switchD_002392e7_caseD_3;
        }
        local_48.int_value_ = uVar6 & 0xffffffff00000000;
        break;
      case 1:
        puVar11 = puVar9 + 1;
        if (puVar8 < puVar11) goto switchD_002392e7_caseD_3;
        uVar6 = *puVar9;
        local_48.int_value_ = uVar6 & 0xffffffff00000000;
        break;
      case 2:
        puVar9 = (ulong *)((long)puVar9 + 1);
        uVar10 = 0;
        uVar6 = 0;
        puVar11 = puVar9;
        while (uVar10 = (ulong)(*(byte *)((long)puVar11 + -1) & 0x7f) << ((byte)uVar6 & 0x3f) |
                        uVar10, (char)*(byte *)((long)puVar11 + -1) < '\0') {
          if (puVar8 <= puVar11) goto switchD_002392e7_caseD_3;
          puVar11 = (ulong *)((long)puVar11 + 1);
          puVar9 = (ulong *)((long)puVar9 + 1);
          bVar2 = 0x38 < uVar6;
          uVar6 = uVar6 + 7;
          if (bVar2) goto switchD_002392e7_caseD_3;
        }
        if (uVar10 <= (ulong)((long)puVar8 - (long)puVar9)) {
          local_48.int_value_ = (ulong)puVar9 & 0xffffffff00000000;
          puVar11 = (ulong *)((long)puVar11 + uVar10);
          uVar6 = (ulong)puVar9 & 0xffffffff;
          goto LAB_00239687;
        }
      default:
        goto switchD_002392e7_caseD_3;
      case 5:
        puVar11 = (ulong *)((long)puVar9 + 4);
        if (puVar8 < puVar11) goto switchD_002392e7_caseD_3;
        uVar6 = (ulong)(uint)*puVar9;
        local_48.int_value_ = 0;
      }
      uVar10 = 0;
LAB_00239687:
      local_38 = puVar11;
    } while ((0xffff < (uint)uVar4) || (0xfffffff < uVar10));
    local_48.int_value_ = local_48.int_value_ | uVar6 & 0xffffffff;
    uVar6 = uVar4 << 0x20 | uVar10;
    local_48.type_ = (byte)(uVar6 >> 0x30) | (byte)uVar7 & 7;
    local_48.size_ = (uint32_t)uVar10;
    local_48.id_ = (uint16_t)(uVar6 >> 0x20);
    sVar3 = (short)uVar4;
  }
switchD_002392e7_caseD_3:
  return puVar8 == local_38;
}

Assistant:

bool TraceConfig_CmdTraceStartDelay::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* min_delay_ms */:
        field.get(&min_delay_ms_);
        break;
      case 2 /* max_delay_ms */:
        field.get(&max_delay_ms_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}